

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

bool __thiscall ProStringList::contains(ProStringList *this,QString *str,CaseSensitivity cs)

{
  bool bVar1;
  long in_FS_OFFSET;
  ProString local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ProString::ProString(&local_50,str);
  bVar1 = contains(this,&local_50,cs);
  if (&(local_50.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_50.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool contains(const QString &str, Qt::CaseSensitivity cs = Qt::CaseSensitive) const
        { return contains(ProString(str), cs); }